

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::ProcessMessages
          (PeerManagerImpl *this,CNode *pfrom,atomic<bool> *interruptMsgProc)

{
  __int_type_conflict _Var1;
  long lVar2;
  _Elt_pointer pCVar3;
  _Elt_pointer pCVar4;
  element_type *args_2;
  element_type *peVar5;
  bool bVar6;
  undefined1 uVar7;
  ChainstateManager *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  Span<const_unsigned_char> __args_2;
  PeerRef peer;
  CTransactionRef porphanTx_1;
  CTransactionRef porphanTx;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  string local_178;
  string local_158;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock109;
  optional<std::pair<CNetMessage,_bool>_> poll_result;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
  if ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     ((pfrom->m_conn_type != INBOUND &&
      ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       m_outbound_version_message_sent != true)))) {
LAB_001a8600:
    uVar7 = 0;
    goto LAB_001a8602;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&poll_result,
             &(peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_getdata_requests_mutex,"peer->m_getdata_requests_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x1509,false);
  if (((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    ProcessGetData(this,pfrom,
                   peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,interruptMsgProc);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&poll_result);
  args_2 = peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xd51,false);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock2,&this->m_tx_download_mutex,"m_tx_download_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xd51,false);
  porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while (TxOrphanage::GetTxToReconsider((TxOrphanage *)&porphanTx_1,(NodeId)&this->m_orphanage),
        peVar5 = porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,
        porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
    this_00 = this->m_chainman;
    ChainstateManager::ProcessTransaction
              ((MempoolAcceptResult *)&poll_result,this_00,&porphanTx_1,false);
    if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
        super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
        super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._0_4_ == 0) {
      bVar6 = ::LogAcceptCategory(TXPACKAGES,(Level)this_00);
      if (bVar6) {
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&criticalblock109,
                   (base_blob<256u> *)
                   &(porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_158,
                   (base_blob<256u> *)
                   &(porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x62;
        logging_function._M_str = "ProcessOrphanTx";
        logging_function._M_len = 0xf;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,0xd5c,TXPACKAGES,Debug,
                   (ConstevalFormatString<2U>)0x68c114,(string *)&criticalblock109,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&criticalblock109);
      }
      ProcessValidTx(this,args_2->m_id,&porphanTx_1,
                     (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)((long)&poll_result.
                                super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                                _M_payload.
                                super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                                .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                                _M_payload + 0x50));
LAB_001a8548:
      MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&poll_result);
      break;
    }
    if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
        super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
        super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._12_4_ != 5) {
      bVar6 = ::LogAcceptCategory(TXPACKAGES,(Level)this_00);
      if (bVar6) {
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&criticalblock109,
                   (base_blob<256u> *)
                   &(porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_158,
                   (base_blob<256u> *)
                   &(porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash);
        ValidationState<TxValidationResult>::ToString_abi_cxx11_
                  (&local_178,
                   (ValidationState<TxValidationResult> *)
                   ((long)&poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                           _M_value.first + 8));
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_00._M_len = 0x62;
        logging_function_00._M_str = "ProcessOrphanTx";
        logging_function_00._M_len = 0xf;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,long,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xd64,TXPACKAGES,Debug,
                   (ConstevalFormatString<4U>)0x68c139,(string *)&criticalblock109,&local_158,
                   &args_2->m_id,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&criticalblock109);
      }
      if ((poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
           super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_ == 1) &&
         ((0xd < (uint)poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                       super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._12_4_
          || ((0x2801U >>
               (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._12_4_ &
               0x1f) & 1) == 0)))) {
        ProcessInvalidTx(this,args_2->m_id,&porphanTx_1,
                         (TxValidationState *)
                         ((long)&poll_result.
                                 super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                                 .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                                 _M_payload._M_value.first + 8),false);
      }
      goto LAB_001a8548;
    }
    MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&poll_result);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&porphanTx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&porphanTx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  _Var1 = (pfrom->fDisconnect)._M_base._M_i;
  if (peVar5 != (element_type *)0x0 || (_Var1 & 1U) != 0) {
    uVar7 = _Var1 ^ 1;
    goto LAB_001a8602;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&poll_result,
             &(peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_getdata_requests_mutex,"peer->m_getdata_requests_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x1519,false);
  pCVar3 = ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pCVar4 = ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&poll_result);
  uVar7 = 1;
  if (pCVar3 != pCVar4) goto LAB_001a8602;
  if (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0) goto LAB_001a8600;
  CNode::PollMessage(&poll_result,pfrom);
  if (poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
      super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_engaged == false) {
LAB_001a86c4:
    uVar7 = 0;
  }
  else {
    if ((this->m_opts).capture_messages == true) {
      __args_2.m_data =
           (uchar *)(CONCAT44(poll_result.
                              super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                              .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                              _M_payload._4_4_,
                              poll_result.
                              super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                              .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                              _M_payload._0_4_) +
                    poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.
                    first.m_recv.m_read_pos);
      __args_2.m_size =
           CONCAT44(poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._12_4_,
                    poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._8_4_) -
           (long)__args_2.m_data;
      std::
      function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
      ::operator()(&CaptureMessage_abi_cxx11_,&pfrom->addr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                           _M_value.first + 0x30),__args_2,true);
    }
    ProcessMessage(this,pfrom,
                   (string *)
                   ((long)&poll_result.
                           super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                           .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload.
                           _M_value.first + 0x30),(DataStream *)&poll_result,
                   poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                   super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.
                   first.m_time.__r,interruptMsgProc);
    if (((interruptMsgProc->_M_base)._M_i & 1U) != 0) goto LAB_001a86c4;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock109,
               &(peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_getdata_requests_mutex,"peer->m_getdata_requests_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0x153a,false);
    uVar7 = poll_result.super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>._M_payload.
            super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
            super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.second;
    if (((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      uVar7 = 1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock109.super_unique_lock);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock109,&this->m_tx_download_mutex,"m_tx_download_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0x1542,false);
    bVar6 = TxOrphanage::HaveTxToReconsider
                      (&this->m_orphanage,
                       (peer.
                        super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_id);
    if (bVar6) {
      uVar7 = 1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock109.super_unique_lock);
  }
  std::_Optional_payload_base<std::pair<CNetMessage,_bool>_>::_M_reset
            ((_Optional_payload_base<std::pair<CNetMessage,_bool>_> *)&poll_result);
LAB_001a8602:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (bool)(uVar7 & 1);
}

Assistant:

bool PeerManagerImpl::ProcessMessages(CNode* pfrom, std::atomic<bool>& interruptMsgProc)
{
    AssertLockNotHeld(m_tx_download_mutex);
    AssertLockHeld(g_msgproc_mutex);

    PeerRef peer = GetPeerRef(pfrom->GetId());
    if (peer == nullptr) return false;

    // For outbound connections, ensure that the initial VERSION message
    // has been sent first before processing any incoming messages
    if (!pfrom->IsInboundConn() && !peer->m_outbound_version_message_sent) return false;

    {
        LOCK(peer->m_getdata_requests_mutex);
        if (!peer->m_getdata_requests.empty()) {
            ProcessGetData(*pfrom, *peer, interruptMsgProc);
        }
    }

    const bool processed_orphan = ProcessOrphanTx(*peer);

    if (pfrom->fDisconnect)
        return false;

    if (processed_orphan) return true;

    // this maintains the order of responses
    // and prevents m_getdata_requests to grow unbounded
    {
        LOCK(peer->m_getdata_requests_mutex);
        if (!peer->m_getdata_requests.empty()) return true;
    }

    // Don't bother if send buffer is too full to respond anyway
    if (pfrom->fPauseSend) return false;

    auto poll_result{pfrom->PollMessage()};
    if (!poll_result) {
        // No message to process
        return false;
    }

    CNetMessage& msg{poll_result->first};
    bool fMoreWork = poll_result->second;

    TRACE6(net, inbound_message,
        pfrom->GetId(),
        pfrom->m_addr_name.c_str(),
        pfrom->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.m_recv.size(),
        msg.m_recv.data()
    );

    if (m_opts.capture_messages) {
        CaptureMessage(pfrom->addr, msg.m_type, MakeUCharSpan(msg.m_recv), /*is_incoming=*/true);
    }

    try {
        ProcessMessage(*pfrom, msg.m_type, msg.m_recv, msg.m_time, interruptMsgProc);
        if (interruptMsgProc) return false;
        {
            LOCK(peer->m_getdata_requests_mutex);
            if (!peer->m_getdata_requests.empty()) fMoreWork = true;
        }
        // Does this peer has an orphan ready to reconsider?
        // (Note: we may have provided a parent for an orphan provided
        //  by another peer that was already processed; in that case,
        //  the extra work may not be noticed, possibly resulting in an
        //  unnecessary 100ms delay)
        LOCK(m_tx_download_mutex);
        if (m_orphanage.HaveTxToReconsider(peer->m_id)) fMoreWork = true;
    } catch (const std::exception& e) {
        LogDebug(BCLog::NET, "%s(%s, %u bytes): Exception '%s' (%s) caught\n", __func__, SanitizeString(msg.m_type), msg.m_message_size, e.what(), typeid(e).name());
    } catch (...) {
        LogDebug(BCLog::NET, "%s(%s, %u bytes): Unknown exception caught\n", __func__, SanitizeString(msg.m_type), msg.m_message_size);
    }

    return fMoreWork;
}